

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.h
# Opt level: O3

hash_type __thiscall libchess::Position::calculate_hash(Position *this)

{
  uint uVar1;
  pointer pSVar2;
  _Optional_payload<libchess::Square,_true,_true,_true> _Var3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  Piece piece;
  ulong uVar10;
  
  uVar5 = 0;
  lVar8 = 0;
  do {
    lVar6 = 0;
    do {
      uVar10 = this->piece_type_bb_[(int)*(uint *)((long)&constants::PIECE_TYPES + lVar6)].value_ &
               this->color_bb_[*(int *)((long)&constants::COLORS + lVar8)].value_;
      if (uVar10 != 0) {
        do {
          lVar4 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          puVar7 = &constants::PIECES;
          lVar9 = 0;
          do {
            if (*puVar7 ==
                (*(uint *)((long)&constants::PIECE_TYPES + lVar6) |
                *(int *)((long)&constants::COLORS + lVar8) * 8)) goto LAB_00107dab;
            lVar9 = lVar9 + 0x40;
            puVar7 = puVar7 + 1;
          } while (lVar9 != 0x300);
          lVar9 = 0xffffffc0;
LAB_00107dab:
          uVar5 = uVar5 ^ *(ulong *)(polyglot::random_u64 +
                                    (long)(int)((uint)lVar9 | (uint)lVar4) * 8);
          uVar10 = uVar10 & uVar10 - 1;
        } while (uVar10 != 0);
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x18);
    lVar8 = lVar8 + 4;
    if (lVar8 == 8) {
      pSVar2 = (this->history_).
               super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var3.super__Optional_payload_base<libchess::Square> =
           pSVar2[this->ply_].enpassant_square_.super__Optional_base<libchess::Square,_true,_true>.
           _M_payload.super__Optional_payload_base<libchess::Square>;
      if (((ulong)_Var3.super__Optional_payload_base<libchess::Square> >> 0x20 & 1) != 0) {
        uVar5 = uVar5 ^ *(ulong *)(polyglot::random_u64 +
                                  (ulong)((uint)_Var3.super__Optional_payload_base<libchess::Square>
                                                ._M_payload & 7) * 8 + 0x1820);
      }
      uVar1 = pSVar2[this->ply_].castling_rights_.value_;
      if ((uVar1 & 1) == 0) {
        if ((uVar1 & 2) == 0) {
          if ((uVar1 & 4) == 0) {
            uVar10 = 0x1ef6e6dbb1961ec9;
            if ((uVar1 & 8) == 0) {
              uVar10 = 0;
            }
          }
          else {
            uVar10 = 0xa57e6339dd2cf3a0;
          }
        }
        else {
          uVar10 = 0xf165b587df898190;
        }
      }
      else {
        uVar10 = 0x31d71dce64b2c310;
      }
      return uVar10 ^ uVar5 ^
             *(ulong *)(polyglot::random_u64 +
                       (long)(this->side_to_move_).super_MetaValueType<int>.value_ * 8 + 0x1860);
    }
  } while( true );
}

Assistant:

hash_type calculate_hash() const {
        hash_type hash_value = 0;
        for (Color c : constants::COLORS) {
            for (PieceType pt : constants::PIECE_TYPES) {
                Bitboard bb = piece_type_bb(pt, c);
                while (bb) {
                    hash_value ^= zobrist::piece_square_key(bb.forward_bitscan(), pt, c);
                    bb.forward_popbit();
                }
            }
        }
        auto ep_sq = enpassant_square();
        if (ep_sq) {
            hash_value ^= zobrist::enpassant_key(*ep_sq);
        }
        hash_value ^= zobrist::castling_rights_key(castling_rights());
        hash_value ^= zobrist::side_to_move_key(side_to_move());
        return hash_value;
    }